

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O3

ostream * spvtools::utils::operator<<
                    (ostream *os,
                    HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                    *value)

{
  ostream *poVar1;
  ushort uVar2;
  uint uVar3;
  ostream oVar4;
  short sVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  short sVar10;
  char *pcVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  byte local_45;
  undefined4 local_44;
  char *local_40;
  ulong local_38;
  
  uVar2 = (value->value_).data_;
  uVar9 = (uint)uVar2;
  pcVar11 = "-";
  if (-1 < (short)uVar2) {
    pcVar11 = "";
  }
  uVar12 = uVar2 >> 10 & 0x1f;
  uVar6 = (uint)uVar2 * 4 & 0xffc;
  sVar5 = (short)uVar6;
  sVar10 = 0;
  if (uVar12 != 0 || sVar5 != 0) {
    sVar10 = uVar12 - 0xf;
  }
  if ((uVar12 != 0 || sVar5 != 0) && (uVar2 >> 10 & 0x1f) == 0) {
    uVar7 = uVar6;
    if ((uVar2 >> 9 & 1) == 0) {
      do {
        uVar6 = uVar7 * 2;
        sVar10 = sVar10 + -1;
        uVar3 = uVar7 >> 10;
        uVar7 = uVar6;
      } while ((uVar3 & 1) == 0);
    }
    uVar6 = uVar6 * 2 & 0xff8;
  }
  uVar14 = 3;
  if ((uVar6 & 0xc) == 0) {
    uVar13 = 3;
    do {
      uVar14 = uVar13 - 1;
      if (uVar13 == 1) break;
      uVar7 = uVar6 & 0xf0;
      uVar6 = uVar6 >> 4;
      uVar13 = uVar14;
    } while (uVar7 == 0);
  }
  lVar8 = *(long *)(*(long *)os + -0x18);
  poVar1 = os + lVar8;
  local_44 = *(undefined4 *)(os + lVar8 + 0x18);
  if (os[lVar8 + 0xe1] == (ostream)0x1) {
    oVar4 = poVar1[0xe0];
  }
  else {
    local_40 = pcVar11;
    local_38 = (ulong)uVar2;
    oVar4 = (ostream)std::ios::widen((char)poVar1);
    uVar9 = (uint)local_38;
    poVar1[0xe0] = oVar4;
    poVar1[0xe1] = (ostream)0x1;
    pcVar11 = local_40;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar11,(ulong)(uVar9 >> 0xf));
  std::__ostream_insert<char,std::char_traits<char>>(os,"0x",2);
  local_45 = (uVar12 != 0 || sVar5 != 0) | 0x30;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_45,1);
  if (uVar14 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,".",1);
    lVar8 = *(long *)os;
    *(ulong *)(os + *(long *)(lVar8 + -0x18) + 0x10) = (ulong)uVar14;
    poVar1 = os + *(long *)(lVar8 + -0x18);
    if (os[*(long *)(lVar8 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar1);
      poVar1[0xe1] = (ostream)0x1;
      lVar8 = *(long *)os;
    }
    poVar1[0xe0] = (ostream)0x30;
    *(uint *)(os + *(long *)(lVar8 + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(lVar8 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)os);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"p",1);
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
  pcVar11 = "";
  if (-1 < sVar10) {
    pcVar11 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar11,(ulong)(-1 < sVar10));
  std::ostream::operator<<(os,sVar10);
  lVar8 = *(long *)os;
  *(undefined4 *)(os + *(long *)(lVar8 + -0x18) + 0x18) = local_44;
  lVar8 = *(long *)(lVar8 + -0x18);
  poVar1 = os + lVar8;
  if (os[lVar8 + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar1);
    poVar1[0xe1] = (ostream)0x1;
  }
  poVar1[0xe0] = oVar4;
  return os;
}

Assistant:

T value() const { return value_; }